

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ClosePopupToLevel(int remaining)

{
  int *piVar1;
  int iVar2;
  ImGuiPopupRef *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow **ppIVar6;
  ImGuiPopupRef *__dest;
  int iVar7;
  
  pIVar4 = GImGui;
  iVar2 = (GImGui->OpenPopupStack).Size;
  if (remaining < 1) {
    if (iVar2 < 1) goto LAB_00136a87;
    ppIVar6 = &((GImGui->OpenPopupStack).Data)->ParentWindow;
  }
  else {
    if (iVar2 < remaining) {
LAB_00136a87:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,
                    "value_type &ImVector<ImGuiPopupRef>::operator[](int) [T = ImGuiPopupRef]");
    }
    ppIVar6 = &(GImGui->OpenPopupStack).Data[(ulong)(uint)remaining - 1].Window;
  }
  ImGui::FocusWindow(*ppIVar6);
  pIVar5 = GImGui;
  iVar2 = (pIVar4->OpenPopupStack).Capacity;
  if (iVar2 < remaining) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= remaining) {
      iVar7 = remaining;
    }
    if (iVar2 < iVar7) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiPopupRef *)(*(pIVar5->IO).MemAllocFn)((long)iVar7 * 0x28);
      pIVar3 = (pIVar4->OpenPopupStack).Data;
      if (pIVar3 != (ImGuiPopupRef *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar4->OpenPopupStack).Size * 0x28);
      }
      pIVar3 = (pIVar4->OpenPopupStack).Data;
      if (pIVar3 != (ImGuiPopupRef *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (pIVar4->OpenPopupStack).Data = __dest;
      (pIVar4->OpenPopupStack).Capacity = iVar7;
    }
  }
  (pIVar4->OpenPopupStack).Size = remaining;
  return;
}

Assistant:

static void ClosePopupToLevel(int remaining)
{
    ImGuiContext& g = *GImGui;
    if (remaining > 0)
        ImGui::FocusWindow(g.OpenPopupStack[remaining-1].Window);
    else
        ImGui::FocusWindow(g.OpenPopupStack[0].ParentWindow);
    g.OpenPopupStack.resize(remaining);
}